

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::DataManWriter::BeginStep(DataManWriter *this,StepMode mode,float timeout_sec)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  this->m_CurrentStep = this->m_CurrentStep + 1;
  if (this->m_CombinedSteps == 0) {
    adios2::format::DataManSerializer::NewWriterBuffer
              (&this->m_Serializer,this->m_SerializerBufferSize);
  }
  if (this->m_MonitorActive == true) {
    DataManMonitor::BeginStep(&this->m_Monitor,this->m_CurrentStep);
  }
  std::__cxx11::string::string((string *)&local_28,"Engine",&local_89);
  std::__cxx11::string::string((string *)&local_48,"DataManWriter",&local_8a);
  std::__cxx11::string::string((string *)&local_68,"BeginStep",&local_8b);
  iVar1 = (*(this->super_Engine)._vptr_Engine[4])(this);
  std::__cxx11::to_string(&local_88,CONCAT44(extraout_var,iVar1));
  iVar1 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_28,&local_48,&local_68,&local_88,0,iVar1,5,this->m_Verbosity,INFO);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  lVar2 = std::chrono::_V2::system_clock::now();
  adios2::format::DataManSerializer::AttachTimeStamp(&this->m_Serializer,lVar2 / 1000000);
  return OK;
}

Assistant:

StepStatus DataManWriter::BeginStep(StepMode mode, const float timeout_sec)
{
    ++m_CurrentStep;
    if (m_CombinedSteps == 0)
    {
        m_Serializer.NewWriterBuffer(m_SerializerBufferSize);
    }

    if (m_MonitorActive)
    {
        m_Monitor.BeginStep(m_CurrentStep);
    }

    helper::Log("Engine", "DataManWriter", "BeginStep", std::to_string(CurrentStep()), 0,
                m_Comm.Rank(), 5, m_Verbosity, helper::LogMode::INFO);

    m_Serializer.AttachTimeStamp(std::chrono::duration_cast<std::chrono::milliseconds>(
                                     std::chrono::system_clock::now().time_since_epoch())
                                     .count());

    return StepStatus::OK;
}